

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O3

int uv__signal_loop_once_init(uv_loop_t *loop)

{
  int err;
  uv_loop_t *loop_local;
  
  if (loop->signal_pipefd[0] == -1) {
    loop_local._4_4_ = uv__make_pipe(loop->signal_pipefd,0x40);
    if (loop_local._4_4_ == 0) {
      uv__io_init(&loop->signal_io_watcher,uv__signal_event,loop->signal_pipefd[0]);
      uv__io_start(loop,&loop->signal_io_watcher,1);
      loop_local._4_4_ = 0;
    }
  }
  else {
    loop_local._4_4_ = 0;
  }
  return loop_local._4_4_;
}

Assistant:

static int uv__signal_loop_once_init(uv_loop_t* loop) {
  int err;

  /* Return if already initialized. */
  if (loop->signal_pipefd[0] != -1)
    return 0;

  err = uv__make_pipe(loop->signal_pipefd, UV_NONBLOCK_PIPE);
  if (err)
    return err;

  uv__io_init(&loop->signal_io_watcher,
              uv__signal_event,
              loop->signal_pipefd[0]);
  uv__io_start(loop, &loop->signal_io_watcher, POLLIN);

  return 0;
}